

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

SpatialSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_spatial_find
          (SpatialSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  Vec3fa *pVVar1;
  PrimRef *pPVar2;
  int *piVar3;
  undefined1 (*pauVar4) [16];
  float *pfVar5;
  float fVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  ulong uVar9;
  PrimRef *pPVar10;
  TriangleSplitterFactory *pTVar11;
  Geometry *pGVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  RTCFilterFunctionN p_Var20;
  ulong uVar21;
  RTCFilterFunctionN p_Var22;
  size_t i;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar23;
  ulong uVar24;
  long lVar25;
  size_t dim;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar40;
  float fVar41;
  undefined1 auVar34 [16];
  float fVar42;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar45;
  float fVar46;
  undefined1 auVar44 [16];
  __m128 afVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  float fVar62;
  float fVar65;
  undefined1 auVar63 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar64;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar66;
  undefined1 auVar67 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar68;
  SpatialBinMapping<16UL> mapping;
  TriangleSplitter splitter;
  vint4 bin1;
  vint4 bin0;
  SpatialBinner binner;
  ulong local_9d0;
  ulong local_9c8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_980;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_970;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_960;
  undefined1 local_950 [16];
  float local_940 [4];
  undefined1 local_930 [16];
  float local_920 [4];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  __m128 local_8e0;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_8c0;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_8b0;
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_880;
  float local_870 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_830 [91];
  int local_280 [2];
  undefined8 auStack_278 [31];
  int local_180 [2];
  undefined8 auStack_178 [41];
  
  lVar17 = 0x700;
  paVar23 = local_830;
  do {
    ((undefined1 (*) [16])paVar23)[-1] = _DAT_01f7a9f0;
    *paVar23 = (anon_union_16_2_47237d3f_for_Vec3fa_0)_DAT_01f7aa00;
    ((undefined1 (*) [16])paVar23)[-3] = _DAT_01f7a9f0;
    ((undefined1 (*) [16])paVar23)[-2] = _DAT_01f7aa00;
    ((undefined1 (*) [16])paVar23)[-5] = _DAT_01f7a9f0;
    ((undefined1 (*) [16])paVar23)[-4] = _DAT_01f7aa00;
    *(undefined8 *)((long)&local_880.field_1.x + lVar17) = 0;
    *(undefined8 *)((long)&local_880 + lVar17 + 8U) = 0;
    *(undefined8 *)((long)&local_980 + lVar17) = 0;
    *(undefined8 *)((long)&local_980 + lVar17 + 8) = 0;
    paVar23 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)((undefined1 (*) [16])paVar23 + 6);
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x800);
  fVar43 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[0];
  fVar45 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[1];
  fVar46 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[2];
  local_980.v[3] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[3];
  pVVar1 = &(set->super_CentGeomBBox3fa).geomBounds.upper;
  fVar62 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[2];
  fVar65 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[3];
  auVar63._0_8_ =
       *(ulong *)&(set->super_CentGeomBBox3fa).geomBounds.lower.field_0 & 0x7fffffff7fffffff;
  auVar63._8_4_ = ABS(fVar46);
  auVar63._12_4_ = ABS(local_980.v[3]);
  auVar34._0_8_ = *(ulong *)&pVVar1->field_0 & 0x7fffffff7fffffff;
  auVar34._8_4_ = ABS(fVar62);
  auVar34._12_4_ = ABS(fVar65);
  auVar34 = maxps(auVar63,auVar34);
  fVar33 = auVar34._0_4_ * 1.5258789e-05;
  fVar40 = auVar34._4_4_ * 1.5258789e-05;
  auVar30._4_4_ = fVar40;
  auVar30._0_4_ = fVar33;
  fVar41 = auVar34._8_4_ * 1.5258789e-05;
  fVar42 = auVar34._12_4_ * 1.5258789e-05;
  auVar67._0_4_ = (pVVar1->field_0).m128[0] - fVar43;
  auVar67._4_4_ = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[1] - fVar45;
  auVar67._8_4_ = fVar62 - fVar46;
  auVar67._12_4_ = fVar65 - local_980.v[3];
  auVar30._8_4_ = fVar41;
  auVar30._12_4_ = fVar42;
  auVar34 = maxps(auVar30,auVar67);
  auVar34 = divps(_DAT_01f7bb50,auVar34);
  afVar47[0] = -(uint)(fVar33 < auVar67._0_4_) & auVar34._0_4_;
  afVar47[1] = -(uint)(fVar40 < auVar67._4_4_) & auVar34._4_4_;
  afVar47[2] = -(uint)(fVar41 < auVar67._8_4_) & auVar34._8_4_;
  afVar47[3] = (float)(-(uint)(fVar42 < auVar67._12_4_) & auVar34._12_4_);
  local_970.i[0] = afVar47[0];
  local_970.i[1] = afVar47[1];
  local_970.i[2] = afVar47[2];
  local_970.i[3] = (int)afVar47[3];
  local_980.v[0] = fVar43;
  local_980.v[1] = fVar45;
  local_980.v[2] = fVar46;
  uVar58 = (undefined4)DAT_01f7ba10;
  uVar59 = DAT_01f7ba10._4_4_;
  uVar60 = DAT_01f7ba10._8_4_;
  uVar61 = DAT_01f7ba10._12_4_;
  local_960.v = (__m128)divps(_DAT_01f7ba10,afVar47);
  uVar24 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar9 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  if (uVar24 < uVar9) {
    pPVar10 = this->prims0;
    pTVar11 = this->splitterFactory;
    local_8d0 = fVar43;
    fStack_8cc = fVar45;
    fStack_8c8 = fVar46;
    fStack_8c4 = local_980.v[3];
    local_8e0[0] = (float)afVar47[0];
    local_8e0[1] = (float)afVar47[1];
    local_8e0[2] = (float)afVar47[2];
    local_8e0[3] = afVar47[3];
    fVar62 = local_980.v[3];
    do {
      pPVar2 = pPVar10 + uVar24;
      fVar65 = afVar47[0];
      fVar33 = afVar47[1];
      fVar40 = afVar47[2];
      fVar41 = afVar47[3];
      if ((uint)pPVar10[uVar24].lower.field_0.m128[3] < 0x10000000) {
        aVar7 = (pPVar2->lower).field_0.field_1;
        aVar8 = (pPVar2->upper).field_0.field_1;
        auVar56._0_4_ = (int)(((aVar7.x + aVar8.x) * 0.5 - fVar43) * fVar65 + -0.5);
        auVar56._4_4_ = (int)(((aVar7.y + aVar8.y) * 0.5 - fVar45) * fVar33 + -0.5);
        auVar56._8_4_ = (int)(((aVar7.z + aVar8.z) * 0.5 - fVar46) * fVar40 + -0.5);
        auVar56._12_4_ = (int)(((aVar7.field_3.w + aVar8.field_3.w) * 0.5 - fVar62) * fVar41 + -0.5)
        ;
        auVar54._0_4_ = -(uint)(0xe < auVar56._0_4_);
        auVar54._4_4_ = -(uint)(0xe < auVar56._4_4_);
        auVar54._8_4_ = -(uint)(0xe < auVar56._8_4_);
        auVar54._12_4_ = -(uint)(0xe < auVar56._12_4_);
        auVar56 = ~auVar54 & auVar56;
        auVar57._0_4_ = auVar56._0_4_ >> 0x1f;
        auVar57._4_4_ = auVar56._4_4_ >> 0x1f;
        auVar57._8_4_ = auVar56._8_4_ >> 0x1f;
        auVar57._12_4_ = auVar56._12_4_ >> 0x1f;
        local_950 = ~auVar57 & (auVar54 & _DAT_01f7bb70 | auVar56);
        lVar17 = 0;
        do {
          lVar29 = (long)*(int *)(local_950 + lVar17);
          piVar3 = (int *)((long)local_280 + lVar17 + lVar29 * 0x10);
          *piVar3 = *piVar3 + 1;
          piVar3 = (int *)((long)local_180 + lVar17 + lVar29 * 0x10);
          *piVar3 = *piVar3 + 1;
          auVar34 = *(undefined1 (*) [16])((long)local_870 + lVar17 * 8 + lVar29 * 0x60);
          auVar30 = minps(*(undefined1 (*) [16])((long)&local_880 + lVar17 * 8 + lVar29 * 0x60),
                          (undefined1  [16])aVar7);
          *(undefined1 (*) [16])((long)&local_880 + lVar17 * 8 + lVar29 * 0x60) = auVar30;
          auVar34 = maxps(auVar34,(undefined1  [16])aVar8);
          *(undefined1 (*) [16])((long)local_870 + lVar17 * 8 + lVar29 * 0x60) = auVar34;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0xc);
      }
      else {
        aVar7 = (pPVar2->lower).field_0.field_1;
        auVar49._0_4_ = (int)((aVar7.x - fVar43) * fVar65 + -0.5);
        auVar49._4_4_ = (int)((aVar7.y - fVar45) * fVar33 + -0.5);
        auVar49._8_4_ = (int)((aVar7.z - fVar46) * fVar40 + -0.5);
        auVar49._12_4_ = (int)((aVar7.field_3.w - fVar62) * fVar41 + -0.5);
        auVar35._0_4_ = -(uint)(0xe < auVar49._0_4_);
        auVar35._4_4_ = -(uint)(0xe < auVar49._4_4_);
        auVar35._8_4_ = -(uint)(0xe < auVar49._8_4_);
        auVar35._12_4_ = -(uint)(0xe < auVar49._12_4_);
        auVar49 = ~auVar35 & auVar49;
        auVar50._0_4_ = auVar49._0_4_ >> 0x1f;
        auVar50._4_4_ = auVar49._4_4_ >> 0x1f;
        auVar50._8_4_ = auVar49._8_4_ >> 0x1f;
        auVar50._12_4_ = auVar49._12_4_ >> 0x1f;
        fVar42 = (pPVar2->lower).field_0.m128[3];
        local_890 = ~auVar50 & (auVar35 & _DAT_01f7bb70 | auVar49);
        aVar8 = (pPVar2->upper).field_0.field_1;
        auVar51._0_4_ = (int)((aVar8.x - fVar43) * fVar65 + -0.5);
        auVar51._4_4_ = (int)((aVar8.y - fVar45) * fVar33 + -0.5);
        auVar51._8_4_ = (int)((aVar8.z - fVar46) * fVar40 + -0.5);
        auVar51._12_4_ = (int)((aVar8.field_3.w - fVar62) * fVar41 + -0.5);
        auVar36._0_4_ = -(uint)(0xe < auVar51._0_4_);
        auVar36._4_4_ = -(uint)(0xe < auVar51._4_4_);
        auVar36._8_4_ = -(uint)(0xe < auVar51._8_4_);
        auVar36._12_4_ = -(uint)(0xe < auVar51._12_4_);
        auVar51 = ~auVar36 & auVar51;
        auVar52._0_4_ = auVar51._0_4_ >> 0x1f;
        auVar52._4_4_ = auVar51._4_4_ >> 0x1f;
        auVar52._8_4_ = auVar51._8_4_ >> 0x1f;
        auVar52._12_4_ = auVar51._12_4_ >> 0x1f;
        p_Var20 = (RTCFilterFunctionN)(ulong)(uint)(pPVar2->upper).field_0.m128[3];
        local_8a0 = ~auVar52 & (auVar36 & _DAT_01f7bb70 | auVar51);
        lVar29 = 0x10;
        lVar17 = 0;
        do {
          fVar65 = *(float *)((long)&local_970 + lVar17 * 4);
          if ((fVar65 != 0.0) || (NAN(fVar65))) {
            uVar26 = (ulong)*(int *)(local_890 + lVar17 * 4);
            uVar18 = (ulong)*(int *)(local_8a0 + lVar17 * 4);
            if (*(int *)(local_890 + lVar17 * 4) == *(int *)(local_8a0 + lVar17 * 4)) {
              piVar3 = (int *)((long)local_280 + lVar17 * 4 + uVar26 * 0x10);
              *piVar3 = *piVar3 + 1;
              piVar3 = (int *)((long)local_180 + lVar17 * 4 + uVar26 * 0x10);
              *piVar3 = *piVar3 + 1;
              auVar34 = *(undefined1 (*) [16])((long)local_870 + lVar17 * 0x20 + uVar26 * 0x60);
              auVar30 = minps(*(undefined1 (*) [16])(&local_880 + uVar26 * 6 + lVar17 * 2U),
                              (undefined1  [16])aVar7);
              (&local_880)[uVar26 * 6 + lVar17 * 2U] =
                   (anon_union_16_2_47237d3f_for_Vec3fa_0)auVar30;
              auVar34 = maxps(auVar34,(undefined1  [16])aVar8);
              *(undefined1 (*) [16])((long)local_870 + lVar17 * 0x20 + uVar26 * 0x60) = auVar34;
            }
            else {
              local_8c0.m128[0] = aVar7.x;
              local_8c0.m128[1] = aVar7.y;
              local_8c0.m128[2] = aVar7.z;
              local_8c0.m128[3] = (float)aVar7.field_3;
              local_8b0.m128[0] = aVar8.x;
              local_8b0.m128[1] = aVar8.y;
              local_8b0.m128[2] = aVar8.z;
              local_8b0.m128[3] = (float)aVar8.field_3;
              uVar27 = uVar26;
              local_9c8 = uVar18;
              if (uVar18 < uVar26) {
                local_9c8 = uVar26;
              }
              do {
                uVar21 = uVar27;
                local_9d0 = uVar18;
                if (uVar18 <= uVar21) goto LAB_00c1636a;
                uVar27 = uVar21 + 1;
              } while ((float)(uVar21 + 1) * *(float *)((long)&local_960 + lVar17 * 4) +
                       *(float *)((long)&local_980 + lVar17 * 4) <=
                       *(float *)((long)&local_8c0 + lVar17 * 4));
              local_9c8 = uVar21;
              if (uVar21 < uVar18) {
                uVar27 = uVar18;
                do {
                  local_9d0 = uVar27;
                  if ((float)uVar27 * *(float *)((long)&local_960 + lVar17 * 4) +
                      *(float *)((long)&local_980 + lVar17 * 4) <
                      *(float *)((long)&local_8b0 + lVar17 * 4)) break;
                  uVar27 = uVar27 - 1;
                  local_9d0 = uVar21;
                } while (uVar21 < uVar27);
              }
LAB_00c1636a:
              pGVar12 = (pTVar11->scene->geometries).items[(uint)fVar42 & 0x7ffffff].ptr;
              lVar25 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                       * (long)p_Var20;
              lVar28 = *(long *)&pGVar12->field_0x58;
              lVar13 = *(long *)&pGVar12[1].time_range.upper;
              p_Var22 = pGVar12[1].intersectionFilterN;
              pauVar4 = (undefined1 (*) [16])
                        (lVar13 + (ulong)*(uint *)(lVar28 + lVar25) * (long)p_Var22);
              local_920[0] = *(float *)*pauVar4;
              local_920[1] = *(float *)(*pauVar4 + 4);
              local_920[2] = *(float *)(*pauVar4 + 8);
              local_920[3] = *(float *)(*pauVar4 + 0xc);
              local_950 = *pauVar4;
              pfVar5 = (float *)(lVar13 + (ulong)*(uint *)(lVar28 + 4 + lVar25) * (long)p_Var22);
              local_940[0] = *pfVar5;
              local_940[1] = pfVar5[1];
              local_940[2] = pfVar5[2];
              local_940[3] = pfVar5[3];
              local_930 = *(undefined1 (*) [16])
                           (lVar13 + (ulong)*(uint *)(lVar28 + 8 + lVar25) * (long)p_Var22);
              auVar53._0_4_ = local_930._0_4_ - local_940[0];
              auVar53._4_4_ = local_930._4_4_ - local_940[1];
              auVar53._8_4_ = local_930._8_4_ - local_940[2];
              auVar53._12_4_ = local_930._12_4_ - local_940[3];
              auVar37._0_4_ = local_940[0] - local_920[0];
              auVar37._4_4_ = local_940[1] - local_920[1];
              auVar37._8_4_ = local_940[2] - local_920[2];
              auVar37._12_4_ = local_940[3] - local_920[3];
              auVar55._4_4_ = uVar59;
              auVar55._0_4_ = uVar58;
              auVar55._8_4_ = uVar60;
              auVar55._12_4_ = uVar61;
              local_910 = divps(auVar55,auVar37);
              auVar38._4_4_ = uVar59;
              auVar38._0_4_ = uVar58;
              auVar38._8_4_ = uVar60;
              auVar38._12_4_ = uVar61;
              local_900 = divps(auVar38,auVar53);
              auVar31._0_4_ = local_920[0] - local_930._0_4_;
              auVar31._4_4_ = local_920[1] - local_930._4_4_;
              auVar31._8_4_ = local_920[2] - local_930._8_4_;
              auVar31._12_4_ = local_920[3] - local_930._12_4_;
              auVar39._4_4_ = uVar59;
              auVar39._0_4_ = uVar58;
              auVar39._8_4_ = uVar60;
              auVar39._12_4_ = uVar61;
              local_8f0 = divps(auVar39,auVar31);
              uVar27 = local_9c8;
              aVar64 = aVar8;
              aVar68 = aVar7;
              if (local_9c8 < local_9d0) {
                fVar43 = *(float *)((long)&local_980 + lVar17 * 4);
                fVar45 = *(float *)((long)&local_960 + lVar17 * 4);
                fVar46 = *(float *)(local_950 + lVar17 * 4);
                fVar62 = aVar8.x;
                fVar65 = aVar8.y;
                fVar33 = aVar8.z;
                aVar66.a = aVar8.field_3.a;
                do {
                  uVar19 = (uint)p_Var22;
                  local_9c8 = uVar27 + 1;
                  if ((long)local_9c8 < 0) {
                    uVar19 = (uint)local_9c8 & 1 | (uint)(local_9c8 >> 1);
                  }
                  fVar41 = (float)local_9c8 * fVar45 + fVar43;
                  lVar28 = 0;
                  auVar34 = _DAT_01f7a9f0;
                  auVar30 = _DAT_01f7aa00;
                  fVar40 = fVar46;
                  auVar63 = _DAT_01f7aa00;
                  auVar67 = _DAT_01f7a9f0;
                  do {
                    if (fVar40 <= fVar41) {
                      auVar34 = minps(auVar34,*(undefined1 (*) [16])(local_950 + lVar28));
                      auVar30 = maxps(auVar30,*(undefined1 (*) [16])(local_950 + lVar28));
                    }
                    if (fVar41 <= fVar40) {
                      auVar67 = minps(auVar67,*(undefined1 (*) [16])(local_950 + lVar28));
                      auVar63 = maxps(auVar63,*(undefined1 (*) [16])(local_950 + lVar28));
                    }
                    fVar6 = *(float *)(local_950 + lVar28 + lVar29);
                    if (((fVar40 < fVar41) && (fVar41 < fVar6)) ||
                       ((fVar41 < fVar40 && (fVar6 < fVar41)))) {
                      fVar40 = (fVar41 - fVar40) * *(float *)((long)local_920 + lVar28 + lVar29);
                      auVar56 = *(undefined1 (*) [16])(local_950 + lVar28);
                      auVar48._0_4_ =
                           (*(float *)((long)local_940 + lVar28) - auVar56._0_4_) * fVar40 +
                           auVar56._0_4_;
                      auVar48._4_4_ =
                           (*(float *)((long)local_940 + lVar28 + 4) - auVar56._4_4_) * fVar40 +
                           auVar56._4_4_;
                      auVar48._8_4_ =
                           (*(float *)((long)local_940 + lVar28 + 8) - auVar56._8_4_) * fVar40 +
                           auVar56._8_4_;
                      auVar48._12_4_ =
                           (*(float *)(local_930 + lVar28 + -4) - auVar56._12_4_) * fVar40 +
                           auVar56._12_4_;
                      auVar34 = minps(auVar34,auVar48);
                      auVar30 = maxps(auVar30,auVar48);
                      auVar67 = minps(auVar67,auVar48);
                      auVar63 = maxps(auVar63,auVar48);
                    }
                    lVar28 = lVar28 + 0x10;
                    fVar40 = fVar6;
                  } while (lVar28 != 0x30);
                  auVar34 = maxps(auVar34,(undefined1  [16])aVar68);
                  auVar14._4_4_ = fVar65;
                  auVar14._0_4_ = fVar62;
                  auVar14._8_4_ = fVar33;
                  auVar14._12_4_ = aVar66.a;
                  auVar30 = minps(auVar30,auVar14);
                  auVar44._4_4_ = -(uint)(auVar34._4_4_ <= auVar30._4_4_);
                  auVar44._0_4_ = -(uint)(auVar34._0_4_ <= auVar30._0_4_);
                  auVar44._8_4_ = -(uint)(auVar34._8_4_ <= auVar30._8_4_);
                  auVar44._12_4_ = -(uint)(auVar34._12_4_ <= auVar30._12_4_);
                  uVar58 = movmskps(uVar19,auVar44);
                  if ((~(byte)uVar58 & 7) != 0) {
                    uVar26 = uVar26 + 1;
                  }
                  aVar68 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                           maxps(auVar67,(undefined1  [16])aVar68);
                  auVar15._4_4_ = fVar65;
                  auVar15._0_4_ = fVar62;
                  auVar15._8_4_ = fVar33;
                  auVar15._12_4_ = aVar66.a;
                  aVar64 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                           minps(auVar63,auVar15);
                  auVar63 = *(undefined1 (*) [16])((long)local_870 + lVar17 * 0x20 + uVar27 * 0x60);
                  auVar34 = minps(*(undefined1 (*) [16])(&local_880 + uVar27 * 6 + lVar17 * 2U),
                                  auVar34);
                  (&local_880)[uVar27 * 6 + lVar17 * 2U] =
                       (anon_union_16_2_47237d3f_for_Vec3fa_0)auVar34;
                  auVar34 = maxps(auVar63,auVar30);
                  *(undefined1 (*) [16])((long)local_870 + lVar17 * 0x20 + uVar27 * 0x60) = auVar34;
                  fVar62 = aVar64.x;
                  fVar65 = aVar64.y;
                  fVar33 = aVar64.z;
                  aVar66 = aVar64.field_3;
                  uVar27 = local_9c8;
                  p_Var22 = p_Var20;
                } while (local_9c8 != local_9d0);
                uVar58 = 0x3f800000;
                uVar59 = 0x3f800000;
                uVar60 = 0x3f800000;
                uVar61 = 0x3f800000;
                uVar27 = local_9d0;
                afVar47 = local_8e0;
                fVar43 = local_8d0;
                fVar45 = fStack_8cc;
                fVar46 = fStack_8c8;
                fVar62 = fStack_8c4;
              }
              auVar32._4_4_ = -(uint)(aVar68.y <= aVar64.y);
              auVar32._0_4_ = -(uint)(aVar68.x <= aVar64.x);
              auVar32._8_4_ = -(uint)(aVar68.z <= aVar64.z);
              auVar32._12_4_ = -(uint)(aVar68.field_3.w <= aVar64.field_3.w);
              uVar16 = movmskps((int)local_9c8,auVar32);
              if ((~(byte)uVar16 & 7) != 0) {
                uVar18 = uVar18 - 1;
              }
              piVar3 = (int *)((long)local_280 + lVar17 * 4 + uVar26 * 0x10);
              *piVar3 = *piVar3 + 1;
              piVar3 = (int *)((long)local_180 + lVar17 * 4 + uVar18 * 0x10);
              *piVar3 = *piVar3 + 1;
              auVar34 = *(undefined1 (*) [16])((long)local_870 + lVar17 * 0x20 + uVar27 * 0x60);
              auVar30 = minps(*(undefined1 (*) [16])(&local_880 + uVar27 * 6 + lVar17 * 2U),
                              (undefined1  [16])aVar68);
              (&local_880)[uVar27 * 6 + lVar17 * 2U] =
                   (anon_union_16_2_47237d3f_for_Vec3fa_0)auVar30;
              auVar34 = maxps(auVar34,(undefined1  [16])aVar64);
              *(undefined1 (*) [16])((long)local_870 + lVar17 * 0x20 + uVar27 * 0x60) = auVar34;
            }
          }
          lVar17 = lVar17 + 1;
          lVar29 = lVar29 + 4;
        } while (lVar17 != 3);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar9);
  }
  SpatialBinInfo<16UL,_embree::PrimRef>::best
            (__return_storage_ptr__,(SpatialBinInfo<16UL,_embree::PrimRef> *)&local_880.field_1,
             (SpatialBinMapping<16UL> *)&local_980,logBlockSize);
  return __return_storage_ptr__;
}

Assistant:

sequential_spatial_find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SpatialBinner binner(empty); 
          const SpatialBinMapping<SPATIAL_BINS> mapping(set);
          binner.bin2(splitterFactory,prims0,set.begin(),set.end(),mapping);
          /* todo: best spatial split not exceeding the extended range does not provide any benefit ?*/
          return binner.best(mapping,logBlockSize); //,set.ext_size());
        }